

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity_State_PDU.cpp
# Opt level: O3

KBOOL __thiscall
KDIS::PDU::Entity_State_PDU::operator==(Entity_State_PDU *this,Entity_State_PDU *Value)

{
  pointer pKVar1;
  pointer pKVar2;
  KBOOL KVar3;
  pointer pKVar4;
  VariableParameter **ppVVar5;
  bool bVar6;
  
  KVar3 = Header7::operator!=(&this->super_Header,&Value->super_Header);
  if (((((!KVar3) &&
        (KVar3 = DATA_TYPE::EntityIdentifier::operator!=(&this->m_EntityID,&Value->m_EntityID),
        !KVar3)) && (this->m_ui8ForceID == Value->m_ui8ForceID)) &&
      (((this->m_ui8NumOfVariableParams == Value->m_ui8NumOfVariableParams &&
        (KVar3 = DATA_TYPE::EntityType::operator!=(&this->m_EntityType,&Value->m_EntityType), !KVar3
        )) && ((KVar3 = DATA_TYPE::EntityType::operator!=
                                  (&this->m_AltEntityType,&Value->m_AltEntityType), !KVar3 &&
               ((KVar3 = DATA_TYPE::Vector::operator!=
                                   (&this->m_EntityLinearVelocity,&Value->m_EntityLinearVelocity),
                !KVar3 && (KVar3 = DATA_TYPE::WorldCoordinates::operator!=
                                             (&this->m_EntityLocation,&Value->m_EntityLocation),
                          !KVar3)))))))) &&
     ((KVar3 = DATA_TYPE::EulerAngles::operator!=
                         (&this->m_EntityOrientation,&Value->m_EntityOrientation), !KVar3 &&
      ((((KVar3 = DATA_TYPE::EntityAppearance::operator!=
                            (&this->m_EntityAppearance,&Value->m_EntityAppearance), !KVar3 &&
         (KVar3 = DATA_TYPE::DeadReckoningParameter::operator!=
                            (&this->m_DeadReckoningParameter,&Value->m_DeadReckoningParameter),
         !KVar3)) &&
        (KVar3 = DATA_TYPE::EntityMarking::operator!=
                           (&this->m_EntityMarking,&Value->m_EntityMarking), !KVar3)) &&
       (KVar3 = DATA_TYPE::EntityCapabilities::operator!=
                          (&this->m_EntityCapabilities,&Value->m_EntityCapabilities), !KVar3)))))) {
    pKVar1 = (this->m_vVariableParameters).
             super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pKVar2 = (this->m_vVariableParameters).
             super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pKVar4 = (Value->m_vVariableParameters).
             super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((long)pKVar2 - (long)pKVar1 ==
        (long)(Value->m_vVariableParameters).
              super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>
              ._M_impl.super__Vector_impl_data._M_finish - (long)pKVar4) {
      if (pKVar1 == pKVar2) {
        return true;
      }
      ppVVar5 = &pKVar4->m_pRef;
      do {
        pKVar4 = pKVar1 + 1;
        bVar6 = pKVar1->m_pRef == *ppVVar5;
        if (!bVar6) {
          return bVar6;
        }
        ppVVar5 = ppVVar5 + 3;
        pKVar1 = pKVar4;
      } while (pKVar4 != pKVar2);
      return bVar6;
    }
  }
  return false;
}

Assistant:

KBOOL Entity_State_PDU::operator == ( const Entity_State_PDU & Value ) const
{
    if( Header::operator              !=( Value ) )                              return false;
    if( m_EntityID                    != Value.m_EntityID )                      return false;
    if( m_ui8ForceID                  != Value.m_ui8ForceID )                    return false;
    if( m_ui8NumOfVariableParams  != Value.m_ui8NumOfVariableParams )            return false;
    if( m_EntityType                  != Value.m_EntityType )                    return false;
    if( m_AltEntityType               != Value.m_AltEntityType )                 return false;
    if( m_EntityLinearVelocity        != Value.m_EntityLinearVelocity )          return false;
    if( m_EntityLocation              != Value.m_EntityLocation )                return false;
    if( m_EntityOrientation           != Value.m_EntityOrientation )             return false;
    if( m_EntityAppearance            != Value.m_EntityAppearance )              return false;
    if( m_DeadReckoningParameter      != Value.m_DeadReckoningParameter )        return false;
    if( m_EntityMarking               != Value.m_EntityMarking )                 return false;
    if( m_EntityCapabilities          != Value.m_EntityCapabilities )            return false;
    if( m_vVariableParameters         != Value.m_vVariableParameters )           return false;
    return true;
}